

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableGcCompactSettings(void)

{
  undefined8 uVar1;
  ImGuiContext *pIVar2;
  ImGuiTableSettings *__dest;
  char *pcVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int new_capacity;
  ImVector<char> local_38;
  
  pIVar2 = GImGui;
  piVar5 = (int *)(GImGui->SettingsTables).Buf.Data;
  piVar4 = piVar5;
  if (piVar5 != (int *)0x0) {
    piVar4 = piVar5 + 1;
  }
  new_capacity = 0;
  while (piVar4 != (int *)0x0) {
    if (*piVar4 != 0) {
      new_capacity = new_capacity + (short)piVar4[3] * 0x10 + 0x14;
    }
    piVar6 = (int *)((long)piVar4[-1] + (long)piVar4);
    piVar4 = (int *)0x0;
    if (piVar6 != (int *)((long)(GImGui->SettingsTables).Buf.Size + (long)(piVar5 + 1))) {
      piVar4 = piVar6;
    }
  }
  if (new_capacity != (GImGui->SettingsTables).Buf.Size) {
    local_38.Size = 0;
    local_38.Capacity = 0;
    local_38.Data = (char *)0x0;
    ImVector<char>::reserve(&local_38,new_capacity);
    pcVar3 = (pIVar2->SettingsTables).Buf.Data;
    piVar5 = (int *)(pcVar3 + 4);
    if (pcVar3 == (char *)0x0) {
      piVar5 = (int *)0x0;
    }
    while (piVar5 != (int *)0x0) {
      if (*piVar5 != 0) {
        __dest = ImChunkStream<ImGuiTableSettings>::alloc_chunk
                           ((ImChunkStream<ImGuiTableSettings> *)&local_38,
                            (long)(short)piVar5[3] * 0x10 + 0x14);
        memcpy(__dest,piVar5,(long)(short)piVar5[3] * 0x10 + 0x14);
        pcVar3 = (pIVar2->SettingsTables).Buf.Data;
      }
      piVar5 = (int *)((long)piVar5[-1] + (long)piVar5);
      if (piVar5 == (int *)(pcVar3 + (long)(pIVar2->SettingsTables).Buf.Size + 4)) {
        piVar5 = (int *)0x0;
      }
    }
    uVar1._0_4_ = (pIVar2->SettingsTables).Buf.Size;
    uVar1._4_4_ = (pIVar2->SettingsTables).Buf.Capacity;
    (pIVar2->SettingsTables).Buf.Size = local_38.Size;
    (pIVar2->SettingsTables).Buf.Capacity = local_38.Capacity;
    (pIVar2->SettingsTables).Buf.Data = local_38.Data;
    local_38._0_8_ = uVar1;
    local_38.Data = pcVar3;
    ImVector<char>::~ImVector(&local_38);
  }
  return;
}

Assistant:

void ImGui::TableGcCompactSettings()
{
    ImGuiContext& g = *GImGui;
    int required_memory = 0;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            required_memory += (int)TableSettingsCalcChunkSize(settings->ColumnsCount);
    if (required_memory == g.SettingsTables.Buf.Size)
        return;
    ImChunkStream<ImGuiTableSettings> new_chunk_stream;
    new_chunk_stream.Buf.reserve(required_memory);
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            memcpy(new_chunk_stream.alloc_chunk(TableSettingsCalcChunkSize(settings->ColumnsCount)), settings, TableSettingsCalcChunkSize(settings->ColumnsCount));
    g.SettingsTables.swap(new_chunk_stream);
}